

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

size_t * __thiscall
andres::
BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
::shapeBegin(BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
             *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t *psVar3;
  BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  *pBVar4;
  
  sVar1 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->e1_);
  sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(this->e2_);
  pBVar4 = (BinaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
            *)&this->e2_;
  if (sVar2 <= sVar1) {
    pBVar4 = this;
  }
  psVar3 = View<int,_true,_std::allocator<unsigned_long>_>::shapeBegin(pBVar4->e1_);
  return psVar3;
}

Assistant:

const std::size_t* shapeBegin() const 
        { return e1_.dimension() < e2_.dimension() ? e2_.shapeBegin() : e1_.shapeBegin(); }